

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testReaderGenericByName(DataFileTest *this)

{
  int iVar1;
  GenericRecord *pGVar2;
  ssize_t sVar3;
  size_t sVar4;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int *piVar5;
  size_t *local_148;
  size_t *local_140;
  string local_138;
  assertion_result local_118;
  const_string local_100;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  undefined1 *local_d8;
  _func_int **local_d0;
  size_t local_c8;
  undefined4 local_bc;
  lazy_ostream local_b8;
  undefined8 *local_a8;
  char *local_a0;
  Pair p;
  int i;
  size_t n;
  int64_t im;
  int64_t re;
  undefined **local_58;
  GenericRecord *local_50;
  DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> df;
  
  avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::DataFileReader
            (&df,this->filename,&this->writerSchema);
  i = 0;
  p.first.root_.px = (this->writerSchema).root_.px;
  p.first.root_.pn.pi_ = (this->writerSchema).root_.pn.pi_;
  if (p.first.root_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (p.first.root_.pn.pi_)->use_count_ = (p.first.root_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  p.second.type_ = AVRO_NULL;
  p.second.value_.content = (placeholder *)0x0;
  re = 3;
  im = 5;
  local_d0 = (_func_int **)&PTR__lazy_ostream_001b9fb8;
  local_58 = &PTR__lazy_ostream_001ba038;
  __buf = extraout_RDX;
  while( true ) {
    sVar3 = avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::read
                      (&df,(int)&p,__buf,in_RCX);
    if ((char)sVar3 == '\0') break;
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x12d;
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = local_d0;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    n = CONCAT44(n._4_4_,p.second.type_);
    local_c8 = CONCAT44(local_c8._4_4_,8);
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(p.second.type_ == AVRO_RECORD);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_138._M_string_length._0_1_ = 0;
    local_138._M_dataplus._M_p = (pointer)local_58;
    local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.field_2._8_8_ = &local_140;
    local_148 = &local_c8;
    local_e8 = 0;
    local_f0 = local_58;
    local_e0 = &boost::unit_test::lazy_ostream::inst;
    local_140 = &n;
    local_d8 = (undefined1 *)&local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_b8,&local_100,0x12d,REQUIRE,CHECK_EQUAL,2,"ci.type()",&local_138,
               "avro::AVRO_RECORD",&local_f0);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    local_50 = boost::any_cast<avro::GenericRecord>(&p.second.value_);
    n = 2;
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x130;
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = local_d0;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    local_c8 = *(long *)(local_50 + 0x18) - *(long *)(local_50 + 0x10) >> 4;
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_c8 == n);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_140 = &local_c8;
    local_138._M_string_length._0_1_ = 0;
    local_138._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001ba078;
    local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.field_2._8_8_ = &local_140;
    local_e8 = 0;
    local_f0 = &PTR__lazy_ostream_001ba078;
    local_e0 = &boost::unit_test::lazy_ostream::inst;
    local_148 = &n;
    local_d8 = (undefined1 *)&local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_b8,&local_100,0x130,REQUIRE,CHECK_EQUAL,2,"r.fieldCount()",
               &local_138,"n",&local_f0);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"re","");
    pGVar2 = local_50;
    sVar4 = avro::GenericRecord::fieldIndex(local_50,&local_138);
    piVar5 = (int *)(sVar4 * 0x10 + *(long *)(pGVar2 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x132;
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = local_d0;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    iVar1 = *piVar5;
    local_c8 = CONCAT44(local_c8._4_4_,iVar1);
    local_bc = 3;
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 3);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_140 = &local_c8;
    local_138._M_string_length._0_1_ = 0;
    local_138._M_dataplus._M_p = (pointer)local_58;
    local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.field_2._8_8_ = &local_140;
    local_148 = (size_t *)&local_bc;
    local_e8 = 0;
    local_f0 = local_58;
    local_e0 = &boost::unit_test::lazy_ostream::inst;
    local_d8 = (undefined1 *)&local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_b8,&local_100,0x132,REQUIRE,CHECK_EQUAL,2,"f0.type()",&local_138,
               "avro::AVRO_LONG",&local_f0);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x133;
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = local_d0;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    local_140 = (size_t *)boost::any_cast<long>((any *)(piVar5 + 2));
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(*local_140 == re);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_138._M_string_length._0_1_ = 0;
    local_138._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001b9f78;
    local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.field_2._8_8_ = &local_140;
    local_148 = (size_t *)&re;
    local_e8 = 0;
    local_f0 = &PTR__lazy_ostream_001b9f78;
    local_e0 = &boost::unit_test::lazy_ostream::inst;
    local_d8 = (undefined1 *)&local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_b8,&local_100,0x133,CHECK,CHECK_EQUAL,2,"f0.value<int64_t>()",
               &local_138,"re",&local_f0);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"im","");
    pGVar2 = local_50;
    sVar4 = avro::GenericRecord::fieldIndex(local_50,&local_138);
    piVar5 = (int *)(sVar4 * 0x10 + *(long *)(pGVar2 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x136;
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = local_d0;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    iVar1 = *piVar5;
    local_c8 = CONCAT44(local_c8._4_4_,iVar1);
    local_bc = 3;
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 3);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_138._M_string_length._0_1_ = 0;
    local_138._M_dataplus._M_p = (pointer)local_58;
    local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.field_2._8_8_ = &local_140;
    local_148 = (size_t *)&local_bc;
    local_e8 = 0;
    local_f0 = local_58;
    local_e0 = &boost::unit_test::lazy_ostream::inst;
    local_140 = &local_c8;
    local_d8 = (undefined1 *)&local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_b8,&local_100,0x136,REQUIRE,CHECK_EQUAL,2,"f1.type()",&local_138,
               "avro::AVRO_LONG",&local_f0);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1bd8b0,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x19d2e5);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x137;
    local_b8.m_empty = false;
    local_b8._vptr_lazy_ostream = local_d0;
    local_a8 = &boost::unit_test::lazy_ostream::inst;
    local_a0 = "";
    local_140 = (size_t *)boost::any_cast<long>((any *)(piVar5 + 2));
    local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(*local_140 == im);
    local_118.m_message.px = (element_type *)0x0;
    local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_138._M_string_length._0_1_ = 0;
    local_138._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001b9f78;
    local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_138.field_2._8_8_ = &local_140;
    local_148 = (size_t *)&im;
    local_e8 = 0;
    local_f0 = &PTR__lazy_ostream_001b9f78;
    local_e0 = &boost::unit_test::lazy_ostream::inst;
    local_d8 = (undefined1 *)&local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_118,&local_b8,&local_100,0x137,CHECK,CHECK_EQUAL,2,"f1.value<int64_t>()",
               &local_138,"im",&local_f0);
    boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
    in_RCX = re * im;
    im = im + 3;
    i = i + 1;
    __buf = extraout_RDX_00;
    re = in_RCX;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bd8b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19d2e5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x13c;
  local_b8.m_empty = false;
  local_b8._vptr_lazy_ostream = local_d0;
  local_140 = (size_t *)&i;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(i == 1000);
  local_a8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_100.m_end = "";
  local_138._M_string_length._0_1_ = 0;
  local_138._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001b9ff8;
  local_138.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_138.field_2._8_8_ = &local_140;
  local_148 = (size_t *)&count;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_001b9ff8;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = (undefined1 *)&local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,&local_b8,&local_100,0x13c,CHECK,CHECK_EQUAL,2,"i",&local_138,"count",
             &local_f0);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  if (p.second.value_.content != (placeholder *)0x0) {
    (*(p.second.value_.content)->_vptr_placeholder[1])();
  }
  boost::detail::shared_count::~shared_count(&p.first.root_.pn);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&df.base_);
  return;
}

Assistant:

void testReaderGenericByName() {
        avro::DataFileReader<Pair> df(filename, writerSchema);
        int i = 0;
        Pair p(writerSchema, GenericDatum());
        int64_t re = 3;
        int64_t im = 5;

        const GenericDatum& ci = p.second;
        while (df.read(p)) {
            BOOST_REQUIRE_EQUAL(ci.type(), avro::AVRO_RECORD);
            const GenericRecord& r = ci.value<GenericRecord>();
            const size_t n = 2;
            BOOST_REQUIRE_EQUAL(r.fieldCount(), n);
            const GenericDatum& f0 = r.field("re");
            BOOST_REQUIRE_EQUAL(f0.type(), avro::AVRO_LONG);
            BOOST_CHECK_EQUAL(f0.value<int64_t>(), re);

            const GenericDatum& f1 = r.field("im");
            BOOST_REQUIRE_EQUAL(f1.type(), avro::AVRO_LONG);
            BOOST_CHECK_EQUAL(f1.value<int64_t>(), im);
            re *= im;
            im += 3;
            ++i;
        }
        BOOST_CHECK_EQUAL(i, count);
    }